

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ResultBuilder::handleResult(ResultBuilder *this,AssertionResult *result)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  IResultCapture *pIVar4;
  IContext *pIVar5;
  IConfig *pIVar6;
  undefined4 extraout_var;
  ulong uVar7;
  undefined8 in_RSI;
  long in_RDI;
  AssertionResult *in_stack_ffffffffffffffc0;
  Ptr<const_Catch::IConfig> *this_00;
  Ptr<const_Catch::IConfig> local_18;
  undefined8 local_10;
  
  local_10 = in_RSI;
  pIVar4 = getResultCapture();
  (*pIVar4->_vptr_IResultCapture[2])(pIVar4,local_10);
  bVar1 = AssertionResult::isOk(in_stack_ffffffffffffffc0);
  if (!bVar1) {
    pIVar5 = getCurrentContext();
    this_00 = &local_18;
    (*pIVar5->_vptr_IContext[6])();
    pIVar6 = Ptr<const_Catch::IConfig>::operator->(this_00);
    uVar2 = (*(pIVar6->super_IShared).super_NonCopyable._vptr_NonCopyable[8])();
    Ptr<const_Catch::IConfig>::~Ptr(this_00);
    if ((uVar2 & 1) != 0) {
      *(undefined1 *)(in_RDI + 0x298) = 1;
    }
    pIVar5 = getCurrentContext();
    iVar3 = (*pIVar5->_vptr_IContext[3])();
    uVar7 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10))();
    if (((uVar7 & 1) != 0) || ((*(uint *)(in_RDI + 0x68) & 1) != 0)) {
      *(undefined1 *)(in_RDI + 0x299) = 1;
    }
  }
  return;
}

Assistant:

void ResultBuilder::handleResult( AssertionResult const& result )
    {
        getResultCapture().assertionEnded( result );

        if( !result.isOk() ) {
            if( getCurrentContext().getConfig()->shouldDebugBreak() )
                m_shouldDebugBreak = true;
            if( getCurrentContext().getRunner()->aborting() || (m_assertionInfo.resultDisposition & ResultDisposition::Normal) )
                m_shouldThrow = true;
        }
    }